

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jaro_winkler.cpp
# Opt level: O1

void duckdb::CachedFunction<duckdb_jaro_winkler::CachedJaroSimilarity<char>>
               (Vector *constant,Vector *other,Vector *result,DataChunk *args)

{
  _func_int **pp_Var1;
  VectorType VVar2;
  idx_t count;
  pointer pcVar3;
  double *pdVar4;
  unsigned_long *puVar5;
  data_ptr_t pdVar6;
  __uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_> _Var7;
  sel_t *psVar8;
  SelectionVector *pSVar9;
  byte bVar10;
  double dVar11;
  undefined1 auVar12 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var13;
  TemplatedValidityData<unsigned_long> *pTVar14;
  unsigned_long uVar15;
  string *psVar16;
  reference other_00;
  idx_t iVar17;
  data_ptr_t pdVar18;
  ulong uVar19;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var20;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var21;
  idx_t iVar22;
  ulong uVar23;
  ulong uVar24;
  ValidityMask *this;
  idx_t idx_in_entry;
  ulong uVar25;
  idx_t iVar26;
  data_ptr_t pdVar27;
  ulong *puVar28;
  data_ptr_t pdVar29;
  UnifiedVectorFormat ldata;
  CachedJaroSimilarity<char> cached;
  value_type score_cutoff;
  string str_val;
  Value val;
  ulong *local_230;
  undefined1 local_208 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_200;
  unsigned_long *local_1f8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1e8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1c8;
  CachedJaroSimilarity<char> local_1c0;
  undefined1 local_168 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_160;
  data_ptr_t local_150;
  undefined1 local_148 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_140;
  element_type *local_138;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_128;
  ValidityMask local_120;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_f8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_e8;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e0;
  long local_d8;
  char local_d0 [16];
  idx_t local_c0;
  UnifiedVectorFormat local_b8;
  Value local_70;
  
  Vector::GetValue(&local_70,constant,0);
  count = args->count;
  if (local_70.is_null == true) {
    FlatVector::VerifyFlatVector(result);
    if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0) {
      local_1c0.s1._M_dataplus._M_p =
           (pointer)(result->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
      make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                ((duckdb *)local_148,(unsigned_long *)&local_1c0);
      p_Var20 = p_Stack_140;
      auVar12 = local_148;
      local_148 = (undefined1  [8])0x0;
      p_Stack_140 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      p_Var21 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                .
                super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi;
      (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)auVar12;
      (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = p_Var20;
      if (p_Var21 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var21);
      }
      if (p_Stack_140 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_140);
      }
      pTVar14 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                          (&(result->validity).super_TemplatedValidityMask<unsigned_long>.
                            validity_data);
      (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
           (unsigned_long *)
           (pTVar14->owned_data).
           super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
           super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
           super__Head_base<0UL,_unsigned_long_*,_false>;
    }
    if (count != 0) {
      uVar23 = count + 0x3f >> 6;
      if (uVar23 != 1) {
        switchD_0105b559::default
                  ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask,0,
                   uVar23 * 8 - 8);
      }
      uVar15 = -1L << ((byte)count & 0x3f);
      if ((count & 0x3f) == 0) {
        uVar15 = 0;
      }
      (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar23 - 1] =
           uVar15;
    }
    goto LAB_01b4ce0e;
  }
  psVar16 = StringValue::Get_abi_cxx11_(&local_70);
  local_e0._M_current = local_d0;
  pcVar3 = (psVar16->_M_dataplus)._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_e0,pcVar3,pcVar3 + psVar16->_M_string_length);
  duckdb_jaro_winkler::CachedJaroSimilarity<char>::
  CachedJaroSimilarity<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
            (&local_1c0,local_e0,
             (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )(local_e0._M_current + local_d8));
  if ((long)(args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
            super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
            super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
            super__Vector_impl_data._M_start == 0xd0) {
    if (other->vector_type == FLAT_VECTOR) {
      Vector::SetVectorType(result,FLAT_VECTOR);
      pdVar27 = result->data;
      pdVar6 = other->data;
      FlatVector::VerifyFlatVector(other);
      FlatVector::VerifyFlatVector(result);
      puVar5 = (other->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if (puVar5 == (unsigned_long *)0x0) {
        if (count != 0) {
          local_230 = (ulong *)(pdVar6 + 8);
          iVar26 = 0;
          do {
            local_148 = (undefined1  [8])local_230[-1];
            p_Stack_140 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*local_230;
            p_Var21 = p_Stack_140;
            if (((ulong)local_148 & 0xffffffff) < 0xd) {
              p_Var21 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_148 + 4);
            }
            dVar11 = duckdb_jaro_winkler::detail::
                     jaro_similarity<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,char_const*>
                               (&local_1c0.PM,
                                (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 )local_1c0.s1._M_dataplus._M_p,
                                (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 )(local_1c0.s1._M_dataplus._M_p + local_1c0.s1._M_string_length),
                                (char *)p_Var21,
                                (char *)((long)&p_Var21->_vptr__Sp_counted_base +
                                        ((ulong)local_148 & 0xffffffff)),0.0);
            *(double *)(pdVar27 + iVar26 * 8) = dVar11;
            iVar26 = iVar26 + 1;
            local_230 = local_230 + 2;
          } while (count != iVar26);
        }
      }
      else {
        (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask = puVar5;
        shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                  (&(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data,
                   &(other->validity).super_TemplatedValidityMask<unsigned_long>.validity_data);
        (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity =
             (other->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
        if (0x3f < count + 0x3f) {
          uVar19 = 0;
          uVar23 = 0;
          do {
            puVar5 = (other->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar5 == (unsigned_long *)0x0) {
              uVar15 = 0xffffffffffffffff;
            }
            else {
              uVar15 = puVar5[uVar19];
            }
            uVar25 = uVar23 + 0x40;
            if (count <= uVar23 + 0x40) {
              uVar25 = count;
            }
            uVar24 = uVar25;
            if (uVar15 != 0) {
              uVar24 = uVar23;
              if (uVar15 == 0xffffffffffffffff) {
                if (uVar23 < uVar25) {
                  puVar28 = (ulong *)(pdVar6 + uVar23 * 0x10 + 8);
                  do {
                    local_148 = (undefined1  [8])puVar28[-1];
                    p_Stack_140 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*puVar28;
                    p_Var21 = p_Stack_140;
                    if (((ulong)local_148 & 0xffffffff) < 0xd) {
                      p_Var21 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_148 + 4);
                    }
                    dVar11 = duckdb_jaro_winkler::detail::
                             jaro_similarity<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,char_const*>
                                       (&local_1c0.PM,
                                        (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                         )local_1c0.s1._M_dataplus._M_p,
                                        (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                         )(local_1c0.s1._M_dataplus._M_p +
                                          local_1c0.s1._M_string_length),(char *)p_Var21,
                                        (char *)((long)&p_Var21->_vptr__Sp_counted_base +
                                                ((ulong)local_148 & 0xffffffff)),0.0);
                    *(double *)(pdVar27 + uVar24 * 8) = dVar11;
                    uVar24 = uVar24 + 1;
                    puVar28 = puVar28 + 2;
                  } while (uVar25 != uVar24);
                }
              }
              else if (uVar23 < uVar25) {
                puVar28 = (ulong *)(pdVar6 + uVar23 * 0x10 + 8);
                uVar24 = 0;
                do {
                  if ((uVar15 >> (uVar24 & 0x3f) & 1) != 0) {
                    local_148 = (undefined1  [8])puVar28[-1];
                    p_Stack_140 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*puVar28;
                    p_Var21 = p_Stack_140;
                    if (((ulong)local_148 & 0xffffffff) < 0xd) {
                      p_Var21 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_148 + 4);
                    }
                    dVar11 = duckdb_jaro_winkler::detail::
                             jaro_similarity<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,char_const*>
                                       (&local_1c0.PM,
                                        (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                         )local_1c0.s1._M_dataplus._M_p,
                                        (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                         )(local_1c0.s1._M_dataplus._M_p +
                                          local_1c0.s1._M_string_length),(char *)p_Var21,
                                        (char *)((long)&p_Var21->_vptr__Sp_counted_base +
                                                ((ulong)local_148 & 0xffffffff)),0.0);
                    *(double *)(pdVar27 + uVar24 * 8 + uVar23 * 8) = dVar11;
                  }
                  uVar24 = uVar24 + 1;
                  puVar28 = puVar28 + 2;
                } while ((uVar23 - uVar25) + uVar24 != 0);
                uVar24 = uVar23 + uVar24;
              }
            }
            uVar19 = uVar19 + 1;
            uVar23 = uVar24;
          } while (uVar19 != count + 0x3f >> 6);
        }
      }
    }
    else if (other->vector_type == CONSTANT_VECTOR) {
      Vector::SetVectorType(result,CONSTANT_VECTOR);
      pdVar4 = (double *)result->data;
      puVar28 = (ulong *)other->data;
      puVar5 = (other->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar5 == (unsigned_long *)0x0) || ((*puVar5 & 1) != 0)) {
        ConstantVector::SetNull(result,false);
        local_148 = (undefined1  [8])*puVar28;
        p_Stack_140 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar28[1];
        p_Var21 = p_Stack_140;
        if (((ulong)local_148 & 0xffffffff) < 0xd) {
          p_Var21 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_148 + 4);
        }
        dVar11 = duckdb_jaro_winkler::detail::
                 jaro_similarity<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,char_const*>
                           (&local_1c0.PM,
                            (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             )local_1c0.s1._M_dataplus._M_p,
                            (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             )(local_1c0.s1._M_dataplus._M_p + local_1c0.s1._M_string_length),
                            (char *)p_Var21,
                            (char *)((long)&p_Var21->_vptr__Sp_counted_base +
                                    ((ulong)local_148 & 0xffffffff)),0.0);
        *pdVar4 = dVar11;
      }
      else {
        ConstantVector::SetNull(result,true);
      }
    }
    else {
      UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_148);
      Vector::ToUnifiedFormat(other,count,(UnifiedVectorFormat *)local_148);
      Vector::SetVectorType(result,FLAT_VECTOR);
      p_Var21 = p_Stack_140;
      auVar12 = local_148;
      pdVar27 = result->data;
      FlatVector::VerifyFlatVector(result);
      if (local_138 == (element_type *)0x0) {
        if (count != 0) {
          _Var7._M_t.super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
          super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
               (((unsafe_unique_array<unsigned_long> *)auVar12)->
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>)._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t;
          iVar26 = 0;
          do {
            iVar17 = iVar26;
            if ((_Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>)
                _Var7._M_t.
                super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl != (unsigned_long *)0x0)
            {
              iVar17 = (idx_t)*(uint *)((long)_Var7._M_t.
                                              super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                                              .super__Head_base<0UL,_unsigned_long_*,_false>.
                                              _M_head_impl + iVar26 * 4);
            }
            local_208 = (undefined1  [8])p_Var21[iVar17]._vptr__Sp_counted_base;
            p_Stack_200 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                           &p_Var21[iVar17]._M_use_count;
            p_Var20 = p_Stack_200;
            if (((ulong)local_208 & 0xffffffff) < 0xd) {
              p_Var20 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_208 + 4);
            }
            dVar11 = duckdb_jaro_winkler::detail::
                     jaro_similarity<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,char_const*>
                               (&local_1c0.PM,
                                (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 )local_1c0.s1._M_dataplus._M_p,
                                (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 )(local_1c0.s1._M_dataplus._M_p + local_1c0.s1._M_string_length),
                                (char *)p_Var20,
                                (char *)((long)&p_Var20->_vptr__Sp_counted_base +
                                        ((ulong)local_208 & 0xffffffff)),0.0);
            *(double *)(pdVar27 + iVar26 * 8) = dVar11;
            iVar26 = iVar26 + 1;
          } while (count != iVar26);
        }
      }
      else if (count != 0) {
        _Var7._M_t.super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
        super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
             (((unsafe_unique_array<unsigned_long> *)auVar12)->
             super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>)._M_t.
             super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t;
        uVar23 = 0;
        do {
          uVar19 = uVar23;
          if ((_Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>)
              _Var7._M_t.
              super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
              super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl != (unsigned_long *)0x0) {
            uVar19 = (ulong)*(uint *)((long)_Var7._M_t.
                                            super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                                            .super__Head_base<0UL,_unsigned_long_*,_false>.
                                            _M_head_impl + uVar23 * 4);
          }
          if (((ulong)(&local_138->_vptr_ExtraTypeInfo)[uVar19 >> 6] >> (uVar19 & 0x3f) & 1) == 0) {
            if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                (unsigned_long *)0x0) {
              local_b8.sel = (SelectionVector *)
                             (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
              make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                        ((duckdb *)local_208,(unsigned_long *)&local_b8);
              p_Var13 = p_Stack_200;
              auVar12 = local_208;
              local_208 = (undefined1  [8])0x0;
              p_Stack_200 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              p_Var20 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                        internal.
                        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi;
              (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr = (element_type *)auVar12;
              (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi = p_Var13;
              if (p_Var20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var20);
              }
              if (p_Stack_200 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_200);
              }
              pTVar14 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                  (&(result->validity).super_TemplatedValidityMask<unsigned_long>.
                                    validity_data);
              (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                   (unsigned_long *)
                   (pTVar14->owned_data).
                   super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                   super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                   super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                   super__Head_base<0UL,_unsigned_long_*,_false>;
            }
            bVar10 = (byte)uVar23 & 0x3f;
            puVar28 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask +
                      (uVar23 >> 6);
            *puVar28 = *puVar28 & (-2L << bVar10 | 0xfffffffffffffffeU >> 0x40 - bVar10);
          }
          else {
            local_208 = (undefined1  [8])p_Var21[uVar19]._vptr__Sp_counted_base;
            p_Stack_200 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                           &p_Var21[uVar19]._M_use_count;
            p_Var20 = p_Stack_200;
            if (((ulong)local_208 & 0xffffffff) < 0xd) {
              p_Var20 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_208 + 4);
            }
            dVar11 = duckdb_jaro_winkler::detail::
                     jaro_similarity<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,char_const*>
                               (&local_1c0.PM,
                                (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 )local_1c0.s1._M_dataplus._M_p,
                                (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 )(local_1c0.s1._M_dataplus._M_p + local_1c0.s1._M_string_length),
                                (char *)p_Var20,
                                (char *)((long)&p_Var20->_vptr__Sp_counted_base +
                                        ((ulong)local_208 & 0xffffffff)),0.0);
            *(double *)(pdVar27 + uVar23 * 8) = dVar11;
          }
          uVar23 = uVar23 + 1;
        } while (count != uVar23);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_120.super_TemplatedValidityMask<unsigned_long>.capacity !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_120.super_TemplatedValidityMask<unsigned_long>.capacity);
      }
      if (local_128._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_128._M_pi);
      }
    }
  }
  else {
    other_00 = vector<duckdb::Vector,_true>::operator[](&args->data,2);
    Vector::Vector((Vector *)local_148,other_00);
    VVar2 = other->vector_type;
    if ((VVar2 ^ CONSTANT_VECTOR) == FLAT_VECTOR && ((byte)local_148[0] ^ 2) == 0) {
      Vector::SetVectorType(result,CONSTANT_VECTOR);
      puVar5 = (other->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      pdVar4 = (double *)result->data;
      if (((puVar5 == (unsigned_long *)0x0) || ((*puVar5 & 1) != 0)) &&
         ((local_120.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
           (unsigned_long *)0x0 ||
          ((*local_120.super_TemplatedValidityMask<unsigned_long>.validity_mask & 1) != 0)))) {
        local_208 = *(undefined1 (*) [8])other->data;
        p_Stack_200 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)other->data + 8);
        p_Var21 = p_Stack_200;
        if (((ulong)local_208 & 0xffffffff) < 0xd) {
          p_Var21 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_208 + 4);
        }
        dVar11 = duckdb_jaro_winkler::detail::
                 jaro_similarity<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,char_const*>
                           (&local_1c0.PM,
                            (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             )local_1c0.s1._M_dataplus._M_p,
                            (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             )(local_1c0.s1._M_dataplus._M_p + local_1c0.s1._M_string_length),
                            (char *)p_Var21,
                            (char *)((long)&p_Var21->_vptr__Sp_counted_base +
                                    ((ulong)local_208 & 0xffffffff)),
                            (double)(local_128._M_pi)->_vptr__Sp_counted_base);
        *pdVar4 = dVar11;
      }
      else {
LAB_01b4cd68:
        ConstantVector::SetNull(result,true);
      }
    }
    else if (((byte)local_148[0] ^ 2) == 0 && VVar2 == FLAT_VECTOR) {
      pdVar27 = other->data;
      if ((local_120.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
           (unsigned_long *)0x0) &&
         ((*local_120.super_TemplatedValidityMask<unsigned_long>.validity_mask & 1) == 0)) {
LAB_01b4cd5b:
        Vector::SetVectorType(result,CONSTANT_VECTOR);
        goto LAB_01b4cd68;
      }
      Vector::SetVectorType(result,FLAT_VECTOR);
      pdVar6 = result->data;
      FlatVector::VerifyFlatVector(result);
      FlatVector::VerifyFlatVector(other);
      FlatVector::VerifyFlatVector(result);
      (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
           (other->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                (&(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data,
                 &(other->validity).super_TemplatedValidityMask<unsigned_long>.validity_data);
      (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity =
           (other->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
      if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
          (unsigned_long *)0x0) {
        if (count != 0) {
          pp_Var1 = (local_128._M_pi)->_vptr__Sp_counted_base;
          puVar28 = (ulong *)(pdVar27 + 8);
          iVar26 = 0;
          do {
            local_208 = (undefined1  [8])puVar28[-1];
            p_Stack_200 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*puVar28;
            p_Var21 = p_Stack_200;
            if (((ulong)local_208 & 0xffffffff) < 0xd) {
              p_Var21 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_208 + 4);
            }
            dVar11 = duckdb_jaro_winkler::detail::
                     jaro_similarity<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,char_const*>
                               (&local_1c0.PM,
                                (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 )local_1c0.s1._M_dataplus._M_p,
                                (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 )(local_1c0.s1._M_dataplus._M_p + local_1c0.s1._M_string_length),
                                (char *)p_Var21,
                                (char *)((long)&p_Var21->_vptr__Sp_counted_base +
                                        ((ulong)local_208 & 0xffffffff)),(double)pp_Var1);
            *(double *)(pdVar6 + iVar26 * 8) = dVar11;
            iVar26 = iVar26 + 1;
            puVar28 = puVar28 + 2;
          } while (count != iVar26);
        }
      }
      else if (0x3f < count + 0x3f) {
        pdVar29 = (data_ptr_t)(count + 0x3f >> 6);
        pdVar18 = (data_ptr_t)0x0;
        uVar23 = 0;
        local_150 = pdVar29;
        do {
          puVar5 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if (puVar5 == (unsigned_long *)0x0) {
            uVar15 = 0xffffffffffffffff;
          }
          else {
            uVar15 = puVar5[(long)pdVar18];
          }
          uVar19 = uVar23 + 0x40;
          if (count <= uVar23 + 0x40) {
            uVar19 = count;
          }
          uVar25 = uVar19;
          if (uVar15 != 0) {
            uVar25 = uVar23;
            if (uVar15 == 0xffffffffffffffff) {
              if (uVar23 < uVar19) {
                pp_Var1 = (local_128._M_pi)->_vptr__Sp_counted_base;
                puVar28 = (ulong *)(pdVar27 + uVar23 * 0x10 + 8);
                do {
                  local_208 = (undefined1  [8])puVar28[-1];
                  p_Stack_200 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*puVar28;
                  p_Var21 = p_Stack_200;
                  if (((ulong)local_208 & 0xffffffff) < 0xd) {
                    p_Var21 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_208 + 4);
                  }
                  dVar11 = duckdb_jaro_winkler::detail::
                           jaro_similarity<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,char_const*>
                                     (&local_1c0.PM,
                                      (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                       )local_1c0.s1._M_dataplus._M_p,
                                      (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                       )(local_1c0.s1._M_dataplus._M_p +
                                        local_1c0.s1._M_string_length),(char *)p_Var21,
                                      (char *)((long)&p_Var21->_vptr__Sp_counted_base +
                                              ((ulong)local_208 & 0xffffffff)),(double)pp_Var1);
                  *(double *)(pdVar6 + uVar25 * 8) = dVar11;
                  uVar25 = uVar25 + 1;
                  puVar28 = puVar28 + 2;
                } while (uVar19 != uVar25);
              }
            }
            else if (uVar23 < uVar19) {
              puVar28 = (ulong *)(pdVar27 + uVar23 * 0x10 + 8);
              uVar25 = 0;
              do {
                if ((uVar15 >> (uVar25 & 0x3f) & 1) != 0) {
                  local_208 = (undefined1  [8])puVar28[-1];
                  p_Stack_200 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*puVar28;
                  p_Var21 = p_Stack_200;
                  if (((ulong)local_208 & 0xffffffff) < 0xd) {
                    p_Var21 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_208 + 4);
                  }
                  dVar11 = duckdb_jaro_winkler::detail::
                           jaro_similarity<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,char_const*>
                                     (&local_1c0.PM,
                                      (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                       )local_1c0.s1._M_dataplus._M_p,
                                      (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                       )(local_1c0.s1._M_dataplus._M_p +
                                        local_1c0.s1._M_string_length),(char *)p_Var21,
                                      (char *)((long)&p_Var21->_vptr__Sp_counted_base +
                                              ((ulong)local_208 & 0xffffffff)),
                                      (double)(local_128._M_pi)->_vptr__Sp_counted_base);
                  *(double *)(pdVar6 + uVar25 * 8 + uVar23 * 8) = dVar11;
                }
                uVar25 = uVar25 + 1;
                puVar28 = puVar28 + 2;
              } while ((uVar23 - uVar19) + uVar25 != 0);
              uVar25 = uVar23 + uVar25;
              pdVar29 = local_150;
            }
          }
          pdVar18 = pdVar18 + 1;
          uVar23 = uVar25;
        } while (pdVar18 != pdVar29);
      }
    }
    else if ((VVar2 ^ CONSTANT_VECTOR) == FLAT_VECTOR && local_148[0] == (duckdb)0x0) {
      puVar28 = (ulong *)other->data;
      puVar5 = (other->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar5 != (unsigned_long *)0x0) && ((*puVar5 & 1) == 0)) goto LAB_01b4cd5b;
      Vector::SetVectorType(result,FLAT_VECTOR);
      pdVar27 = result->data;
      FlatVector::VerifyFlatVector(result);
      FlatVector::VerifyFlatVector((Vector *)local_148);
      FlatVector::VerifyFlatVector(result);
      (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
           local_120.super_TemplatedValidityMask<unsigned_long>.validity_mask;
      shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                (&(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data,
                 &local_120.super_TemplatedValidityMask<unsigned_long>.validity_data);
      (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity =
           local_120.super_TemplatedValidityMask<unsigned_long>.capacity;
      if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
          (unsigned_long *)0x0) {
        if (count != 0) {
          pSVar9 = (SelectionVector *)*puVar28;
          p_Var21 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar28[1];
          iVar26 = 0;
          uVar23 = (ulong)pSVar9 & 0xffffffff;
          do {
            p_Var20 = p_Var21;
            if (uVar23 < 0xd) {
              p_Var20 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_208 + 4);
            }
            local_208 = (undefined1  [8])pSVar9;
            p_Stack_200 = p_Var21;
            dVar11 = duckdb_jaro_winkler::detail::
                     jaro_similarity<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,char_const*>
                               (&local_1c0.PM,
                                (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 )local_1c0.s1._M_dataplus._M_p,
                                (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 )(local_1c0.s1._M_dataplus._M_p + local_1c0.s1._M_string_length),
                                (char *)p_Var20,
                                (char *)((long)&p_Var20->_vptr__Sp_counted_base + uVar23),
                                (double)(&(local_128._M_pi)->_vptr__Sp_counted_base)[iVar26]);
            *(double *)(pdVar27 + iVar26 * 8) = dVar11;
            iVar26 = iVar26 + 1;
          } while (count != iVar26);
        }
      }
      else if (0x3f < count + 0x3f) {
        uVar19 = 0;
        uVar23 = 0;
        do {
          puVar5 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if (puVar5 == (unsigned_long *)0x0) {
            uVar15 = 0xffffffffffffffff;
          }
          else {
            uVar15 = puVar5[uVar19];
          }
          uVar25 = uVar23 + 0x40;
          if (count <= uVar23 + 0x40) {
            uVar25 = count;
          }
          uVar24 = uVar25;
          if (uVar15 != 0) {
            uVar24 = uVar23;
            if (uVar15 == 0xffffffffffffffff) {
              if (uVar23 < uVar25) {
                pSVar9 = (SelectionVector *)*puVar28;
                p_Var21 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar28[1];
                uVar23 = (ulong)pSVar9 & 0xffffffff;
                do {
                  p_Var20 = p_Var21;
                  if (uVar23 < 0xd) {
                    p_Var20 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_208 + 4);
                  }
                  local_208 = (undefined1  [8])pSVar9;
                  p_Stack_200 = p_Var21;
                  dVar11 = duckdb_jaro_winkler::detail::
                           jaro_similarity<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,char_const*>
                                     (&local_1c0.PM,
                                      (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                       )local_1c0.s1._M_dataplus._M_p,
                                      (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                       )(local_1c0.s1._M_dataplus._M_p +
                                        local_1c0.s1._M_string_length),(char *)p_Var20,
                                      (char *)((long)&p_Var20->_vptr__Sp_counted_base + uVar23),
                                      (double)(&(local_128._M_pi)->_vptr__Sp_counted_base)[uVar24]);
                  *(double *)(pdVar27 + uVar24 * 8) = dVar11;
                  uVar24 = uVar24 + 1;
                } while (uVar25 != uVar24);
              }
            }
            else if (uVar23 < uVar25) {
              uVar24 = 0;
              do {
                if ((uVar15 >> (uVar24 & 0x3f) & 1) != 0) {
                  local_208 = (undefined1  [8])*puVar28;
                  p_Stack_200 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar28[1];
                  p_Var21 = p_Stack_200;
                  if (((ulong)local_208 & 0xffffffff) < 0xd) {
                    p_Var21 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_208 + 4);
                  }
                  dVar11 = duckdb_jaro_winkler::detail::
                           jaro_similarity<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,char_const*>
                                     (&local_1c0.PM,
                                      (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                       )local_1c0.s1._M_dataplus._M_p,
                                      (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                       )(local_1c0.s1._M_dataplus._M_p +
                                        local_1c0.s1._M_string_length),(char *)p_Var21,
                                      (char *)((long)&p_Var21->_vptr__Sp_counted_base +
                                              ((ulong)local_208 & 0xffffffff)),
                                      (double)(&(local_128._M_pi)->_vptr__Sp_counted_base)
                                              [uVar23 + uVar24]);
                  *(double *)(pdVar27 + uVar24 * 8 + uVar23 * 8) = dVar11;
                }
                uVar24 = uVar24 + 1;
              } while ((uVar23 - uVar25) + uVar24 != 0);
              uVar24 = uVar23 + uVar24;
            }
          }
          uVar19 = uVar19 + 1;
          uVar23 = uVar24;
        } while (uVar19 != count + 0x3f >> 6);
      }
    }
    else if (local_148[0] == (duckdb)0x0 && VVar2 == FLAT_VECTOR) {
      pdVar27 = other->data;
      Vector::SetVectorType(result,FLAT_VECTOR);
      pdVar6 = result->data;
      FlatVector::VerifyFlatVector(result);
      FlatVector::VerifyFlatVector(other);
      FlatVector::VerifyFlatVector(result);
      (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
           (other->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                (&(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data,
                 &(other->validity).super_TemplatedValidityMask<unsigned_long>.validity_data);
      (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity =
           (other->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
      FlatVector::VerifyFlatVector((Vector *)local_148);
      this = &result->validity;
      ValidityMask::Combine(this,&local_120,count);
      if ((this->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0)
      {
        if (count != 0) {
          puVar28 = (ulong *)(pdVar27 + 8);
          iVar26 = 0;
          do {
            local_208 = (undefined1  [8])puVar28[-1];
            p_Stack_200 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*puVar28;
            p_Var21 = p_Stack_200;
            if (((ulong)local_208 & 0xffffffff) < 0xd) {
              p_Var21 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_208 + 4);
            }
            dVar11 = duckdb_jaro_winkler::detail::
                     jaro_similarity<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,char_const*>
                               (&local_1c0.PM,
                                (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 )local_1c0.s1._M_dataplus._M_p,
                                (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 )(local_1c0.s1._M_dataplus._M_p + local_1c0.s1._M_string_length),
                                (char *)p_Var21,
                                (char *)((long)&p_Var21->_vptr__Sp_counted_base +
                                        ((ulong)local_208 & 0xffffffff)),
                                (double)(&(local_128._M_pi)->_vptr__Sp_counted_base)[iVar26]);
            *(double *)(pdVar6 + iVar26 * 8) = dVar11;
            iVar26 = iVar26 + 1;
            puVar28 = puVar28 + 2;
          } while (count != iVar26);
        }
      }
      else if (0x3f < count + 0x3f) {
        pdVar27 = pdVar27 + 8;
        uVar19 = 0;
        uVar23 = 0;
        local_150 = pdVar27;
        do {
          puVar5 = (this->super_TemplatedValidityMask<unsigned_long>).validity_mask;
          if (puVar5 == (unsigned_long *)0x0) {
            uVar15 = 0xffffffffffffffff;
          }
          else {
            uVar15 = puVar5[uVar19];
          }
          uVar25 = uVar23 + 0x40;
          if (count <= uVar23 + 0x40) {
            uVar25 = count;
          }
          uVar24 = uVar25;
          if (uVar15 != 0) {
            uVar24 = uVar23;
            if (uVar15 == 0xffffffffffffffff) {
              if (uVar23 < uVar25) {
                puVar28 = (ulong *)(pdVar27 + uVar23 * 0x10);
                do {
                  local_208 = (undefined1  [8])puVar28[-1];
                  p_Stack_200 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*puVar28;
                  p_Var21 = p_Stack_200;
                  if (((ulong)local_208 & 0xffffffff) < 0xd) {
                    p_Var21 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_208 + 4);
                  }
                  dVar11 = duckdb_jaro_winkler::detail::
                           jaro_similarity<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,char_const*>
                                     (&local_1c0.PM,
                                      (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                       )local_1c0.s1._M_dataplus._M_p,
                                      (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                       )(local_1c0.s1._M_dataplus._M_p +
                                        local_1c0.s1._M_string_length),(char *)p_Var21,
                                      (char *)((long)&p_Var21->_vptr__Sp_counted_base +
                                              ((ulong)local_208 & 0xffffffff)),
                                      (double)(&(local_128._M_pi)->_vptr__Sp_counted_base)[uVar24]);
                  *(double *)(pdVar6 + uVar24 * 8) = dVar11;
                  uVar24 = uVar24 + 1;
                  puVar28 = puVar28 + 2;
                } while (uVar25 != uVar24);
              }
            }
            else if (uVar23 < uVar25) {
              puVar28 = (ulong *)(pdVar27 + uVar23 * 0x10);
              uVar24 = 0;
              do {
                if ((uVar15 >> (uVar24 & 0x3f) & 1) != 0) {
                  local_208 = (undefined1  [8])puVar28[-1];
                  p_Stack_200 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*puVar28;
                  p_Var21 = p_Stack_200;
                  if (((ulong)local_208 & 0xffffffff) < 0xd) {
                    p_Var21 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_208 + 4);
                  }
                  dVar11 = duckdb_jaro_winkler::detail::
                           jaro_similarity<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,char_const*>
                                     (&local_1c0.PM,
                                      (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                       )local_1c0.s1._M_dataplus._M_p,
                                      (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                       )(local_1c0.s1._M_dataplus._M_p +
                                        local_1c0.s1._M_string_length),(char *)p_Var21,
                                      (char *)((long)&p_Var21->_vptr__Sp_counted_base +
                                              ((ulong)local_208 & 0xffffffff)),
                                      (double)(&(local_128._M_pi)->_vptr__Sp_counted_base)
                                              [uVar23 + uVar24]);
                  *(double *)(pdVar6 + uVar24 * 8 + uVar23 * 8) = dVar11;
                }
                uVar24 = uVar24 + 1;
                puVar28 = puVar28 + 2;
              } while ((uVar23 - uVar25) + uVar24 != 0);
              uVar24 = uVar23 + uVar24;
              pdVar27 = local_150;
            }
          }
          uVar19 = uVar19 + 1;
          uVar23 = uVar24;
        } while (uVar19 != count + 0x3f >> 6);
      }
    }
    else {
      UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_208);
      UnifiedVectorFormat::UnifiedVectorFormat(&local_b8);
      Vector::ToUnifiedFormat(other,count,(UnifiedVectorFormat *)local_208);
      Vector::ToUnifiedFormat((Vector *)local_148,count,&local_b8);
      Vector::SetVectorType(result,FLAT_VECTOR);
      pSVar9 = local_b8.sel;
      p_Var21 = p_Stack_200;
      auVar12 = local_208;
      pdVar27 = result->data;
      FlatVector::VerifyFlatVector(result);
      if (local_b8.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
          (unsigned_long *)0x0 && local_1f8 == (unsigned_long *)0x0) {
        if (count != 0) {
          _Var7._M_t.super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
          super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
               (((unsafe_unique_array<unsigned_long> *)auVar12)->
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>)._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t;
          psVar8 = pSVar9->sel_vector;
          iVar26 = 0;
          do {
            iVar17 = iVar26;
            if ((_Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>)
                _Var7._M_t.
                super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl != (unsigned_long *)0x0)
            {
              iVar17 = (idx_t)*(uint *)((long)_Var7._M_t.
                                              super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                                              .super__Head_base<0UL,_unsigned_long_*,_false>.
                                              _M_head_impl + iVar26 * 4);
            }
            iVar22 = iVar26;
            if (psVar8 != (sel_t *)0x0) {
              iVar22 = (idx_t)psVar8[iVar26];
            }
            local_168 = (undefined1  [8])p_Var21[iVar17]._vptr__Sp_counted_base;
            p_Stack_160 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                           &p_Var21[iVar17]._M_use_count;
            p_Var20 = p_Stack_160;
            if (((ulong)local_168 & 0xffffffff) < 0xd) {
              p_Var20 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_168 + 4);
            }
            dVar11 = duckdb_jaro_winkler::detail::
                     jaro_similarity<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,char_const*>
                               (&local_1c0.PM,
                                (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 )local_1c0.s1._M_dataplus._M_p,
                                (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 )(local_1c0.s1._M_dataplus._M_p + local_1c0.s1._M_string_length),
                                (char *)p_Var20,
                                (char *)((long)&p_Var20->_vptr__Sp_counted_base +
                                        ((ulong)local_168 & 0xffffffff)),
                                *(double *)(local_b8.data + iVar22 * 8));
            *(double *)(pdVar27 + iVar26 * 8) = dVar11;
            iVar26 = iVar26 + 1;
          } while (count != iVar26);
        }
      }
      else if (count != 0) {
        _Var7._M_t.super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
        super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
             (((unsafe_unique_array<unsigned_long> *)auVar12)->
             super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>)._M_t.
             super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t;
        psVar8 = pSVar9->sel_vector;
        uVar23 = 0;
        do {
          uVar19 = uVar23;
          if ((_Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>)
              _Var7._M_t.
              super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
              super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl != (unsigned_long *)0x0) {
            uVar19 = (ulong)*(uint *)((long)_Var7._M_t.
                                            super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                                            .super__Head_base<0UL,_unsigned_long_*,_false>.
                                            _M_head_impl + uVar23 * 4);
          }
          uVar25 = uVar23;
          if (psVar8 != (sel_t *)0x0) {
            uVar25 = (ulong)psVar8[uVar23];
          }
          if (((local_1f8 == (unsigned_long *)0x0) ||
              ((local_1f8[uVar19 >> 6] >> (uVar19 & 0x3f) & 1) != 0)) &&
             ((local_b8.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
               (unsigned_long *)0x0 ||
              ((local_b8.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                [uVar25 >> 6] >> (uVar25 & 0x3f) & 1) != 0)))) {
            local_168 = (undefined1  [8])p_Var21[uVar19]._vptr__Sp_counted_base;
            p_Stack_160 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                           &p_Var21[uVar19]._M_use_count;
            p_Var20 = p_Stack_160;
            if (((ulong)local_168 & 0xffffffff) < 0xd) {
              p_Var20 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_168 + 4);
            }
            dVar11 = duckdb_jaro_winkler::detail::
                     jaro_similarity<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,char_const*>
                               (&local_1c0.PM,
                                (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 )local_1c0.s1._M_dataplus._M_p,
                                (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 )(local_1c0.s1._M_dataplus._M_p + local_1c0.s1._M_string_length),
                                (char *)p_Var20,
                                (char *)((long)&p_Var20->_vptr__Sp_counted_base +
                                        ((ulong)local_168 & 0xffffffff)),
                                *(double *)(local_b8.data + uVar25 * 8));
            *(double *)(pdVar27 + uVar23 * 8) = dVar11;
          }
          else {
            if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                (unsigned_long *)0x0) {
              local_c0 = (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
              make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                        ((duckdb *)local_168,&local_c0);
              p_Var13 = p_Stack_160;
              auVar12 = local_168;
              local_168 = (undefined1  [8])0x0;
              p_Stack_160 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              p_Var20 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                        internal.
                        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi;
              (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr = (element_type *)auVar12;
              (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi = p_Var13;
              if (p_Var20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var20);
              }
              if (p_Stack_160 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_160);
              }
              pTVar14 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                  (&(result->validity).super_TemplatedValidityMask<unsigned_long>.
                                    validity_data);
              (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                   (unsigned_long *)
                   (pTVar14->owned_data).
                   super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                   super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                   super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                   super__Head_base<0UL,_unsigned_long_*,_false>;
            }
            bVar10 = (byte)uVar23 & 0x3f;
            puVar28 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask +
                      (uVar23 >> 6);
            *puVar28 = *puVar28 & (-2L << bVar10 | 0xfffffffffffffffeU >> 0x40 - bVar10);
          }
          uVar23 = uVar23 + 1;
        } while (count != uVar23);
      }
      if (local_b8.owned_sel.selection_data.internal.
          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_b8.owned_sel.selection_data.internal.
                   super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi);
      }
      if (local_b8.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_b8.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                   internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      if (local_1c8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1c8._M_pi);
      }
      if (local_1e8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1e8._M_pi);
      }
    }
    if (local_e8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_e8._M_pi);
    }
    if (local_f8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_f8._M_pi);
    }
    if (local_120.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_120.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    LogicalType::~LogicalType((LogicalType *)&p_Stack_140);
  }
  if (local_1c0.PM.m_extendedAscii.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1c0.PM.m_extendedAscii.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_1c0.PM.m_map.
      super__Vector_base<duckdb_jaro_winkler::common::BitvectorHashmap,_std::allocator<duckdb_jaro_winkler::common::BitvectorHashmap>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1c0.PM.m_map.
                    super__Vector_base<duckdb_jaro_winkler::common::BitvectorHashmap,_std::allocator<duckdb_jaro_winkler::common::BitvectorHashmap>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0.s1._M_dataplus._M_p != &local_1c0.s1.field_2) {
    operator_delete(local_1c0.s1._M_dataplus._M_p);
  }
  if (local_e0._M_current != local_d0) {
    operator_delete(local_e0._M_current);
  }
LAB_01b4ce0e:
  Value::~Value(&local_70);
  return;
}

Assistant:

static void CachedFunction(Vector &constant, Vector &other, Vector &result, DataChunk &args) {
	auto val = constant.GetValue(0);
	idx_t count = args.size();
	if (val.IsNull()) {
		auto &result_validity = FlatVector::Validity(result);
		result_validity.SetAllInvalid(count);
		return;
	}

	auto str_val = StringValue::Get(val);
	auto cached = CACHED_SIMILARITY(str_val);

	D_ASSERT(args.ColumnCount() == 2 || args.ColumnCount() == 3);
	if (args.ColumnCount() == 2) {
		UnaryExecutor::Execute<string_t, double>(other, result, count, [&](const string_t &other_str) {
			auto other_str_begin = other_str.GetData();
			return cached.similarity(other_str_begin, other_str_begin + other_str.GetSize());
		});
	} else {
		auto score_cutoff = args.data[2];
		BinaryExecutor::Execute<string_t, double_t, double>(
		    other, score_cutoff, result, count, [&](const string_t &other_str, const double_t score_cutoff) {
			    auto other_str_begin = other_str.GetData();
			    return cached.similarity(other_str_begin, other_str_begin + other_str.GetSize(), score_cutoff);
		    });
	}
}